

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O2

void __thiscall
coinscachepair_tests::linked_list_iteration::test_method(linked_list_iteration *this)

{
  long lVar1;
  iterator __position;
  CoinsCachePair *sentinel_00;
  CoinsCachePair *pCVar2;
  iterator in_R8;
  iterator pvVar3;
  CoinsCachePair **in_R9;
  CoinsCachePair **ppCVar4;
  _List_node_base *p_Var5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  CoinsCachePair *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  CoinsCachePair *local_120;
  char *local_118;
  char *local_110;
  undefined **local_108;
  undefined1 local_100;
  undefined1 *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  CoinsCachePair *local_c8;
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  nodes;
  CoinsCachePair sentinel;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            (&sentinel);
  sentinel.second.m_flags = '\x01';
  sentinel.second.m_prev = &sentinel;
  sentinel.second.m_next = &sentinel;
  CreatePairs_abi_cxx11_(&nodes,(coinscachepair_tests *)&sentinel,sentinel_00);
  local_c8 = sentinel.second.m_next;
  p_Var5 = (_List_node_base *)&nodes;
  while( true ) {
    p_Var5 = (((_List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)&nodes) break;
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_d0 = "";
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x2d;
    file.m_begin = (iterator)&local_d8;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e8,msg);
    local_120 = (CoinsCachePair *)(p_Var5 + 1);
    local_100 = 0;
    local_108 = &PTR__lazy_ostream_011480b0;
    local_f8 = boost::unit_test::lazy_ostream::inst;
    local_f0 = "";
    local_118 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_110 = "";
    in_R8 = (iterator)0x2;
    in_R9 = &local_120;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>const*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (&local_108,&local_118,0x2d,1,2,in_R9,"&expected",&local_c8,"node");
    local_c8 = (local_c8->second).m_next;
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x30;
  file_00.m_begin = (iterator)&local_130;
  msg_00.m_end = (iterator)in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  local_120 = &sentinel;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_011480b0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_148 = "";
  pvVar3 = (iterator)0x2;
  ppCVar4 = &local_c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_108,&local_150,0x30,1,2,ppCVar4,"node",&local_120,"&sentinel");
  p_Var5 = (_List_node_base *)&nodes;
  pCVar2 = sentinel.second.m_next;
  while( true ) {
    p_Var5 = (((_List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    local_c8 = pCVar2;
    if (p_Var5 == (_List_node_base *)&nodes) break;
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_158 = "";
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x36;
    file_01.m_begin = (iterator)&local_160;
    msg_01.m_end = (iterator)ppCVar4;
    msg_01.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_170,
               msg_01);
    local_120 = (CoinsCachePair *)(p_Var5 + 1);
    local_100 = 0;
    local_108 = &PTR__lazy_ostream_011480b0;
    local_f8 = boost::unit_test::lazy_ostream::inst;
    local_f0 = "";
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_178 = "";
    pvVar3 = (iterator)0x2;
    ppCVar4 = &local_120;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>const*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (&local_108,&local_180,0x36,1,2,ppCVar4,"&expected",&local_c8,"node");
    pCVar2 = (local_c8->second).m_next;
    CCoinsCacheEntry::ClearFlags(&local_c8->second);
  }
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x3b;
  file_02.m_begin = (iterator)&local_190;
  msg_02.m_end = (iterator)ppCVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a0,
             msg_02);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_011480b0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  pvVar3 = (iterator)0x2;
  ppCVar4 = &local_c8;
  local_120 = &sentinel;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_108,&local_1b0,0x3b,1,2,ppCVar4,"node",&local_120,"&sentinel");
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x3d;
  file_03.m_begin = (iterator)&local_1c0;
  msg_03.m_end = (iterator)ppCVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d0,
             msg_03);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_011480b0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1d8 = "";
  ppCVar4 = &local_120;
  local_120 = sentinel.second.m_next;
  pvVar3 = (iterator)0x2;
  local_1e8 = &sentinel;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_108,&local_1e0,0x3d,1,2,ppCVar4,"sentinel.second.Next()",&local_1e8,"&sentinel")
  ;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x3e;
  file_04.m_begin = (iterator)&local_1f8;
  msg_04.m_end = (iterator)ppCVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_208,
             msg_04);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_011480b0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_210 = "";
  ppCVar4 = &local_120;
  local_120 = sentinel.second.m_prev;
  pvVar3 = (iterator)0x2;
  local_1e8 = &sentinel;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_108,&local_218,0x3e,1,2,ppCVar4,"sentinel.second.Prev()",&local_1e8,"&sentinel")
  ;
  for (__position._M_node =
            nodes.
            super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
      __position._M_node != (_List_node_base *)&nodes;
      __position = std::__cxx11::
                   list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                   ::erase(&nodes,__position._M_node)) {
    local_228 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_220 = "";
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x42;
    file_05.m_begin = (iterator)&local_228;
    msg_05.m_end = (iterator)ppCVar4;
    msg_05.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_238,
               msg_05);
    local_100 = 0;
    local_108 = &PTR__lazy_ostream_011480b0;
    local_f8 = boost::unit_test::lazy_ostream::inst;
    local_f0 = "";
    local_248 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_240 = "";
    local_1e8 = (CoinsCachePair *)
                CONCAT71(local_1e8._1_7_,*(undefined1 *)&__position._M_node[4]._M_prev);
    local_120 = (CoinsCachePair *)((ulong)local_120 & 0xffffffff00000000);
    pvVar3 = (iterator)0x2;
    ppCVar4 = &local_1e8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (&local_108,&local_248,0x42,1,2,ppCVar4,"it->second.GetFlags()",&local_120,"0");
  }
  std::__cxx11::
  _List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_clear(&nodes.
              super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
            );
  CCoinsCacheEntry::~CCoinsCacheEntry(&sentinel.second);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(linked_list_iteration)
{
    CoinsCachePair sentinel;
    sentinel.second.SelfRef(sentinel);
    auto nodes{CreatePairs(sentinel)};

    // Check iterating through pairs is identical to iterating through a list
    auto node{sentinel.second.Next()};
    for (const auto& expected : nodes) {
        BOOST_CHECK_EQUAL(&expected, node);
        node = node->second.Next();
    }
    BOOST_CHECK_EQUAL(node, &sentinel);

    // Check iterating through pairs is identical to iterating through a list
    // Clear the flags during iteration
    node = sentinel.second.Next();
    for (const auto& expected : nodes) {
        BOOST_CHECK_EQUAL(&expected, node);
        auto next = node->second.Next();
        node->second.ClearFlags();
        node = next;
    }
    BOOST_CHECK_EQUAL(node, &sentinel);
    // Check that sentinel's next and prev are itself
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &sentinel);

    // Delete the nodes from the list to make sure there are no dangling pointers
    for (auto it{nodes.begin()}; it != nodes.end(); it = nodes.erase(it)) {
        BOOST_CHECK_EQUAL(it->second.GetFlags(), 0);
    }
}